

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatterSPH.cpp
# Opt level: O2

ChNodeSPH * __thiscall chrono::ChNodeSPH::operator=(ChNodeSPH *this,ChNodeSPH *other)

{
  ChCollisionModel *pCVar1;
  double dVar2;
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> _Stack_48;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  if (other != this) {
    ChNodeXYZ::operator=(&this->super_ChNodeXYZ,&other->super_ChNodeXYZ);
    (*this->collision_model->_vptr_ChCollisionModel[3])();
    pCVar1 = this->collision_model;
    std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&_Stack_48,
               &(other->container->matsurface).
                super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>);
    local_38 = 0;
    uStack_30 = 0;
    local_28 = 0;
    (*pCVar1->_vptr_ChCollisionModel[0x13])(other->coll_rad,pCVar1,&_Stack_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_48._M_refcount);
    (*this->collision_model->_vptr_ChCollisionModel[0x16])
              (this->collision_model,&(this->super_ChNodeXYZ).field_0x50);
    this->container = other->container;
    (this->UserForce).m_data[0] = (other->UserForce).m_data[0];
    (this->UserForce).m_data[1] = (other->UserForce).m_data[1];
    (this->UserForce).m_data[2] = (other->UserForce).m_data[2];
    SetKernelRadius(this,other->h_rad);
    SetCollisionRadius(this,other->coll_rad);
    (**(code **)((long)(other->super_ChNodeXYZ).super_ChLoadableUVW + 0x90))(other);
    (**(code **)((long)(this->super_ChNodeXYZ).super_ChLoadableUVW + 0x98))(this);
    dVar2 = other->density;
    this->volume = other->volume;
    this->density = dVar2;
    ChVariablesNode::operator=(&this->variables,&other->variables);
  }
  return this;
}

Assistant:

ChNodeSPH& ChNodeSPH::operator=(const ChNodeSPH& other) {
    if (&other == this)
        return *this;

    ChNodeXYZ::operator=(other);

    collision_model->ClearModel();
    collision_model->AddPoint(other.container->GetMaterialSurface(), other.coll_rad);
    collision_model->SetContactable(this);
    container = other.container;
    UserForce = other.UserForce;
    SetKernelRadius(other.h_rad);
    SetCollisionRadius(other.coll_rad);
    SetMass(other.GetMass());
    volume = other.volume;
    density = other.density;

    variables = other.variables;

    return *this;
}